

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexTransformUndc(Abc_Cex_t *p,char *pInit)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  Abc_Cex_t *pAVar4;
  int local_38;
  int local_34;
  int nAddPis;
  int iAddPi;
  int iBit;
  int f;
  int i;
  int nFlops;
  Abc_Cex_t *pCex;
  char *pInit_local;
  Abc_Cex_t *p_local;
  
  sVar3 = strlen(pInit);
  iVar2 = (int)sVar3;
  local_34 = 0;
  local_38 = 0;
  for (iBit = 0; iBit < iVar2; iBit = iBit + 1) {
    local_38 = (uint)(pInit[iBit] == 'x') + local_38;
  }
  pAVar4 = Abc_CexAlloc(iVar2,p->nPis - local_38,p->iFrame + 1);
  pAVar4->iPo = p->iPo;
  pAVar4->iFrame = p->iFrame;
  nAddPis = 0;
  do {
    if (iVar2 <= nAddPis) {
      if (local_34 != local_38) {
        __assert_fail("iAddPi == nAddPis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                      ,0x1d2,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
      }
      for (iAddPi = 0; iAddPi <= p->iFrame; iAddPi = iAddPi + 1) {
        for (iBit = 0; iBit < pAVar4->nPis; iBit = iBit + 1) {
          iVar2 = Abc_InfoHasBit((uint *)(p + 1),p->nRegs + p->nPis * iAddPi + iBit);
          if (iVar2 != 0) {
            Abc_InfoSetBit((uint *)(pAVar4 + 1),nAddPis);
          }
          nAddPis = nAddPis + 1;
        }
      }
      if (nAddPis == pAVar4->nBits) {
        return pAVar4;
      }
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                    ,0x1d8,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
    }
    if (pInit[nAddPis] == '1') {
LAB_0052b616:
      Abc_InfoSetBit((uint *)(pAVar4 + 1),nAddPis);
    }
    else if (pInit[nAddPis] == 'x') {
      iVar1 = Abc_InfoHasBit((uint *)(p + 1),((p->nRegs + p->nPis) - local_38) + local_34);
      if (iVar1 != 0) goto LAB_0052b616;
    }
    local_34 = (uint)(pInit[nAddPis] == 'x') + local_34;
    nAddPis = nAddPis + 1;
  } while( true );
}

Assistant:

Abc_Cex_t * Abc_CexTransformUndc( Abc_Cex_t * p, char * pInit )
{
    Abc_Cex_t * pCex;
    int nFlops = strlen(pInit);
    int i, f, iBit, iAddPi = 0, nAddPis = 0;
    // count how many flops got a new PI
    for ( i = 0; i < nFlops; i++ )
        nAddPis += (int)(pInit[i] == 'x');
    // create new CEX
    pCex = Abc_CexAlloc( nFlops, p->nPis - nAddPis, p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( iBit = 0; iBit < nFlops; iBit++ )
    {
        if ( pInit[iBit] == '1' || (pInit[iBit] == 'x' && Abc_InfoHasBit(p->pData, p->nRegs + p->nPis - nAddPis + iAddPi)) )
            Abc_InfoSetBit( pCex->pData, iBit );
        iAddPi += (int)(pInit[iBit] == 'x');
    }
    assert( iAddPi == nAddPis );
    // add timeframes
    for ( f = 0; f <= p->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + p->nPis * f + i) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}